

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdGetPubkeyFromPrivkey(void *handle,char *privkey,char *wif,bool is_compressed,char **pubkey)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  byte in_CL;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  string key;
  KeyApi api;
  string *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe80;
  allocator local_169;
  string local_168 [32];
  string local_148 [7];
  undefined1 in_stack_fffffffffffffebf;
  string *in_stack_fffffffffffffec0;
  KeyApi *in_stack_fffffffffffffec8;
  allocator local_121;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [37];
  KeyApi local_bb;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined8 *local_30;
  byte local_21;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_21 = in_CL & 1;
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_30 == (undefined8 *)0x0) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x4a2;
    local_58.funcname = "CfdGetPubkeyFromPrivkey";
    cfd::core::logger::warn<>(&local_58,"pubkey is null.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Failed to parameter. pubkey is null.",&local_79);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe40,error_code,in_stack_fffffffffffffe30);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if ((bVar1) && (bVar1 = cfd::capi::IsEmptyString(local_20), bVar1)) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x4a8;
    local_98.funcname = "CfdGetPubkeyFromPrivkey";
    cfd::core::logger::warn<>(&local_98,"privkey is null or empty.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"Failed to parameter. privkey is null or empty.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe40,error_code,in_stack_fffffffffffffe30);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::api::KeyApi::KeyApi(&local_bb);
  std::__cxx11::string::string(local_e0);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    paVar4 = &local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,local_18,paVar4);
    cfd::api::KeyApi::GetPubkeyFromPrivkey
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
    std::__cxx11::string::operator=(local_e0,local_148);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,local_20,&local_121);
    cfd::api::KeyApi::GetPubkeyFromPrivkey
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
    std::__cxx11::string::operator=(local_e0,local_100);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffe80);
  *local_30 = pcVar3;
  local_4 = 0;
  std::__cxx11::string::~string(local_e0);
  return local_4;
}

Assistant:

int CfdGetPubkeyFromPrivkey(
    void* handle, const char* privkey, const char* wif, bool is_compressed,
    char** pubkey) {
  try {
    cfd::Initialize();
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (IsEmptyString(privkey) && IsEmptyString(wif)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    KeyApi api;
    std::string key;
    if (!IsEmptyString(wif)) {
      key = api.GetPubkeyFromPrivkey(wif, is_compressed);
    } else {
      key = api.GetPubkeyFromPrivkey(privkey, is_compressed);
    }
    *pubkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}